

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O3

void __thiscall App::draw(App *this,Graphics *g)

{
  Character *this_00;
  void *pvVar1;
  Brick *pBVar2;
  pointer pFVar3;
  pointer pBVar4;
  vec2 position;
  bool bVar5;
  int iVar6;
  AppState AVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  iterator __position;
  Rng *pRVar11;
  iterator __position_00;
  char *pcVar12;
  Brick *brick;
  Brick *this_01;
  Graphics *g_00;
  byte bVar13;
  Firework *firework_1;
  pointer this_02;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar14;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float y;
  float fVar15;
  float extraout_XMM0_Da_03;
  float y_00;
  vec4 color;
  vec4 color_00;
  vec4 color_01;
  vector<Brick,_std::allocator<Brick>_> *local_168;
  Paddle *local_160;
  Graphics *local_158;
  Enemy enemy;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->state != STARTSCREEN) && (this->state != VICTORY)) {
    iVar6 = piksel::BaseApp::millis(&this->super_BaseApp);
    iVar6 = piksel::Timer::getElapsedTimeInMillis(&this->enemySpawnTimer,iVar6);
    if (this->enemySpawnDelayInMillis < iVar6) {
      iVar6 = piksel::BaseApp::millis(&this->super_BaseApp);
      piksel::Timer::reset(&this->enemySpawnTimer,iVar6);
      if (this->enemySpawnPointToggle == true) {
        enemy.super_AABB.center.field_0 =
             (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
             (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
              )0x4324000041000000;
        enemy.super_AABB.halfDimension.field_0 =
             (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
             (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
              )0x4100000041000000;
        lVar10 = 0x30;
        do {
          *(undefined8 *)((long)enemy.animations + lVar10 + -0x30) = 0;
          *(undefined8 *)((long)&local_168 + lVar10) = 0;
          *(undefined8 *)((long)&local_160 + lVar10) = 0;
          *(undefined8 *)((long)enemy.animations + lVar10 + -0x18) = 100;
          *(undefined4 *)((long)enemy.animations + lVar10 + -0x10) = 0;
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 0x80);
        enemy.state = WALKING;
        enemy.velocity.field_0 =
             (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
             (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
              )0x3f800000;
        enemy.timeOfDeathInMillis = -1;
        Enemy::setup(&enemy,&this->spritesheet);
        std::vector<Enemy,_std::allocator<Enemy>_>::push_back(&this->enemies,&enemy);
        lVar10 = 0x38;
        do {
          pvVar1 = *(void **)((long)enemy.animations + lVar10 + -0x10);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1);
          }
          lVar10 = lVar10 + -0x28;
        } while (lVar10 != -0x18);
      }
      else {
        enemy.super_AABB.center.field_0.field_0.y = 164.0;
        enemy.super_AABB.center.field_0.field_0.x = (float)(this->super_BaseApp).width + -8.0;
        enemy.super_AABB.halfDimension.field_0 =
             (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
             (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
              )0x4100000041000000;
        lVar10 = 0x30;
        do {
          *(undefined8 *)((long)enemy.animations + lVar10 + -0x30) = 0;
          *(undefined8 *)((long)&local_168 + lVar10) = 0;
          *(undefined8 *)((long)&local_160 + lVar10) = 0;
          *(undefined8 *)((long)enemy.animations + lVar10 + -0x18) = 100;
          *(undefined4 *)((long)enemy.animations + lVar10 + -0x10) = 0;
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 0x80);
        enemy.state = WALKING;
        enemy.velocity.field_0 =
             (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
             (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
              )0x80000000bf800000;
        enemy.timeOfDeathInMillis = -1;
        Enemy::setup(&enemy,&this->spritesheet);
        std::vector<Enemy,_std::allocator<Enemy>_>::push_back(&this->enemies,&enemy);
        lVar10 = 0x38;
        do {
          pvVar1 = *(void **)((long)enemy.animations + lVar10 + -0x10);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1);
          }
          lVar10 = lVar10 + -0x28;
        } while (lVar10 != -0x18);
      }
      this->enemySpawnPointToggle = (bool)(this->enemySpawnPointToggle ^ 1);
    }
  }
  piksel::Graphics::background(g,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
  piksel::Graphics::noStroke(g);
  AVar7 = this->state;
  local_158 = g;
  if ((AVar7 & ~GAME) != GAMEOVER) {
    pBVar2 = (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pBVar2; this_01 = this_01 + 1) {
      Brick::draw(this_01,g);
    }
    Paddle::update(&this->paddle,0x20,(int)((float)(this->super_BaseApp).width + -32.0),
                   (vec2)(this->mousePos).field_0.field_0);
    Paddle::draw(&this->paddle,g);
    AVar7 = this->state;
    if (AVar7 == STARTSCREEN) goto LAB_0012aea1;
  }
  __position._M_current =
       (this->enemies).super__Vector_base<Enemy,_std::allocator<Enemy>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->enemies).super__Vector_base<Enemy,_std::allocator<Enemy>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_168 = (vector<Brick,_std::allocator<Brick>_> *)&this->enemies;
    do {
      iVar6 = (this->super_BaseApp).width;
      iVar8 = piksel::BaseApp::millis(&this->super_BaseApp);
      Enemy::update(__position._M_current,iVar6,&this->paddle,&this->bricks,&this->character,iVar8,
                    (this->state & ~GAME) == GAMEOVER);
      iVar6 = Enemy::getTimeOfDeathInMillis(__position._M_current);
      if (iVar6 < 0) {
LAB_0012ad45:
        bVar5 = Enemy::isOutOfBounds
                          (__position._M_current,0,(this->super_BaseApp).width,0x40,
                           (this->super_BaseApp).height);
        if (bVar5) goto LAB_0012ad60;
        Enemy::draw(__position._M_current,local_158);
        __position._M_current = __position._M_current + 1;
      }
      else {
        iVar6 = piksel::BaseApp::millis(&this->super_BaseApp);
        iVar8 = Enemy::getTimeOfDeathInMillis(__position._M_current);
        if (iVar6 - iVar8 < 0xbb9) goto LAB_0012ad45;
LAB_0012ad60:
        __position = std::vector<Enemy,_std::allocator<Enemy>_>::_M_erase
                               ((vector<Enemy,_std::allocator<Enemy>_> *)local_168,__position);
      }
    } while (__position._M_current !=
             (this->enemies).super__Vector_base<Enemy,_std::allocator<Enemy>_>._M_impl.
             super__Vector_impl_data._M_finish);
    AVar7 = this->state;
    g = local_158;
  }
  if (AVar7 == VICTORY) {
    piksel::Graphics::push(g);
    pRVar11 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar11);
    if (extraout_XMM0_Da < 0.1) {
      pRVar11 = piksel::Rng::getInstance();
      piksel::Rng::random(pRVar11);
      position.field_0.field_0.y = (float)(this->super_BaseApp).height;
      position.field_0.field_0.x = (float)extraout_XMM0_Da_00;
      Firework::Firework((Firework *)&enemy,position);
      std::vector<Firework,_std::allocator<Firework>_>::push_back
                (&this->fireworks,(value_type *)&enemy);
      if (enemy.animations[1].frames.
          super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(enemy.animations[1].frames.
                        super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    this_02 = (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar3 = (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_02 != pFVar3) {
      do {
        Firework::applyForce(this_02,(vec2)0x3e4ccccd00000000);
        Firework::update(this_02);
        Firework::draw(this_02,g);
        this_02 = this_02 + 1;
      } while (this_02 != pFVar3);
      __position_00._M_current =
           (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
           super__Vector_impl_data._M_start;
      while (__position_00._M_current !=
             (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        bVar5 = Firework::isDone(__position_00._M_current);
        if (bVar5) {
          __position_00 =
               std::vector<Firework,_std::allocator<Firework>_>::_M_erase
                         (&this->fireworks,__position_00);
        }
        else {
          __position_00._M_current = __position_00._M_current + 1;
        }
      }
    }
    piksel::Graphics::pop(g);
  }
LAB_0012aea1:
  drawBoundaries(this,g);
  iVar6 = (this->super_BaseApp).width;
  this_00 = &this->character;
  iVar8 = (this->super_BaseApp).height;
  iVar9 = piksel::BaseApp::millis(&this->super_BaseApp);
  g_00 = local_158;
  local_168 = &this->bricks;
  local_160 = &this->paddle;
  Character::update(this_00,0x20,(int)((float)iVar6 + -32.0),0x40,iVar8,&this->paddle,&this->bricks,
                    iVar9,(this->super_BaseApp).width / 2,(this->state & ~GAME) == GAMEOVER);
  Character::draw(this_00,g_00);
  if (this->state == GAME) {
    iVar6 = (this->super_BaseApp).width;
    iVar8 = (this->super_BaseApp).height;
    iVar9 = piksel::BaseApp::millis(&this->super_BaseApp);
    g_00 = local_158;
    Ball::update(&this->ball,0x20,(int)((float)iVar6 + -32.0),0x40,iVar8,local_160,local_168,
                 &this->enemySpawnDelayInMillis,iVar6,iVar8,iVar9);
    Ball::draw(&this->ball,g_00);
  }
  drawScores(this,g_00);
  iVar6 = Character::getLives(this_00);
  if ((iVar6 < 1) || (iVar6 = Ball::getLives(&this->ball), iVar6 < 1)) {
    this->state = GAMEOVER;
    pBVar4 = (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
        super__Vector_impl_data._M_finish != pBVar4) {
      (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar4;
    }
  }
  else if ((this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    this->state = VICTORY;
  }
  else {
    if (VICTORY < this->state) {
      return;
    }
    if (this->state == GAME) {
      return;
    }
  }
  piksel::Graphics::push(g_00);
  piksel::Graphics::textSize(g_00,42.0);
  if (this->state == STARTSCREEN) {
    uVar14 = 0x42840000;
  }
  else {
    uVar14 = *(undefined4 *)(&DAT_0017221c + (ulong)(this->state == GAMEOVER) * 4);
  }
  local_168 = (vector<Brick,_std::allocator<Brick>_> *)CONCAT44(local_168._4_4_,uVar14);
  iVar6 = (this->super_BaseApp).height;
  iVar8 = piksel::BaseApp::millis(&this->super_BaseApp);
  iVar8 = piksel::Timer::getElapsedTimeInMillis(&this->glitchTimer,iVar8);
  bVar13 = this->glitch;
  if (this->glitchDuration < iVar8) {
    pRVar11 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar11);
    this->glitchDuration = (int)extraout_XMM0_Da_01;
    iVar8 = piksel::BaseApp::millis(&this->super_BaseApp);
    piksel::Timer::reset(&this->glitchTimer,iVar8);
    bVar13 = this->glitch ^ 1;
    this->glitch = (bool)bVar13;
  }
  if ((bVar13 & 1) != 0) {
    pRVar11 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar11);
    local_160 = (Paddle *)CONCAT44(local_160._4_4_,extraout_XMM0_Da_02);
    pRVar11 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar11);
    piksel::Graphics::scale(g_00,local_160._0_4_,y);
    bVar13 = this->glitch;
  }
  y_00 = (float)(iVar6 / 2 + -0xc);
  fVar15 = 0.0;
  if ((bVar13 & 1) != 0) {
    local_160 = (Paddle *)CONCAT44(local_160._4_4_,y_00);
    pRVar11 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar11);
    fVar15 = extraout_XMM0_Da_03;
    y_00 = local_160._0_4_;
  }
  piksel::Graphics::translate(g_00,local_168._0_4_ + fVar15,y_00);
  enemy.super_AABB.halfDimension.field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
       (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
        )0x0;
  enemy.animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  if (this->state == GAMEOVER) {
    pcVar12 = "GAME OVER";
  }
  else if (this->state == STARTSCREEN) {
    pcVar12 = "Mario breaks out";
  }
  else {
    pcVar12 = "CONGRATULATIONS!";
  }
  enemy.super_AABB.center.field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)enemy.animations;
  std::__cxx11::string::_M_replace((ulong)&enemy,0,(char *)0x0,(ulong)pcVar12);
  piksel::Graphics::fill(g_00,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,enemy.super_AABB.center.field_0,
             (long)enemy.super_AABB.halfDimension.field_0 + (long)enemy.super_AABB.center.field_0);
  piksel::Graphics::text(g_00,&local_50,0.0,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (this->glitch == true) {
    color.field_0._8_8_ = 0x3f0000003f800000;
    color.field_0._0_8_ = 0x3f800000;
    piksel::Graphics::fill(g_00,color);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,enemy.super_AABB.center.field_0,
               (long)enemy.super_AABB.halfDimension.field_0 + (long)enemy.super_AABB.center.field_0)
    ;
    piksel::Graphics::text(g_00,&local_70,-3.0,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    color_00.field_0._8_8_ = 0x3f0000003f800000;
    color_00.field_0._0_8_ = 0x3f80000000000000;
    piksel::Graphics::fill(g_00,color_00);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,enemy.super_AABB.center.field_0,
               (long)enemy.super_AABB.halfDimension.field_0 + (long)enemy.super_AABB.center.field_0)
    ;
    piksel::Graphics::text(g_00,&local_90,3.0,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  color_01.field_0._8_8_ = 0x3f8000003f800000;
  color_01.field_0._0_8_ = 0x3f8000003f800000;
  piksel::Graphics::fill(g_00,color_01);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,enemy.super_AABB.center.field_0,
             (long)enemy.super_AABB.halfDimension.field_0 + (long)enemy.super_AABB.center.field_0);
  piksel::Graphics::text(g_00,&local_b0,0.0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  piksel::Graphics::pop(g_00);
  iVar6 = piksel::Graphics::millis(g_00);
  if (((uint)((ulong)((long)iVar6 * 0x10624dd3) >> 0x26) - (iVar6 >> 0x1f) & 1) == 0) {
    bVar5 = this->state != STARTSCREEN;
    pcVar12 = "PRESS ENTER TO RESTART";
    if (!bVar5) {
      pcVar12 = "PRESS ENTER TO START";
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,pcVar12,pcVar12 + (ulong)bVar5 * 2 + 0x14);
    iVar8 = (this->super_BaseApp).width / 2;
    iVar6 = iVar8 + -0x5f;
    if (this->state != STARTSCREEN) {
      iVar6 = iVar8 + -0x69;
    }
    piksel::Graphics::text
              (g_00,&local_d0,(float)iVar6,(float)((this->super_BaseApp).height / 2 + 0x2a));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (enemy.super_AABB.center.field_0 !=
      (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)enemy.animations) {
    operator_delete((void *)enemy.super_AABB.center.field_0);
  }
  return;
}

Assistant:

void App::draw(piksel::Graphics& g) {
    if (state != STARTSCREEN && state != VICTORY) {
        if (enemySpawnTimer.getElapsedTimeInMillis(millis()) > enemySpawnDelayInMillis) {
            enemySpawnTimer.reset(millis());
            if (enemySpawnPointToggle) {
                Enemy enemy(glm::vec2(ENEMY_WIDTH / 2.0f, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - ENEMY_HEIGHT / 2.0f), glm::vec2(ENEMY_WIDTH / 2.0f, ENEMY_HEIGHT / 2.0f), ENEMY_BASE_VELOCITY);
                enemy.setup(spritesheet);
                enemies.push_back(enemy);
            } else {
                Enemy enemy(glm::vec2(width - ENEMY_WIDTH / 2.0f, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - ENEMY_HEIGHT / 2.0f), glm::vec2(ENEMY_WIDTH / 2.0f, ENEMY_HEIGHT / 2.0f), -ENEMY_BASE_VELOCITY);
                enemy.setup(spritesheet);
                enemies.push_back(enemy);
            }
            enemySpawnPointToggle = !enemySpawnPointToggle;
        }
    }
    g.background(BLACK);
    g.noStroke();
    if (state != GAMEOVER && state != VICTORY) {
        for (Brick& brick : bricks) {
            brick.draw(g);
        }
        paddle.update(BRICK_WIDTH, width - BRICK_WIDTH, mousePos);
        paddle.draw(g);
    }
    if (state != STARTSCREEN) {
        std::vector<Enemy>::iterator it = enemies.begin();
        while (it != enemies.end()) {
            Enemy& enemy = *it;
            enemy.update(width, paddle, bricks, character, millis(), state == VICTORY || state == GAMEOVER);
            if ((enemy.getTimeOfDeathInMillis() > -1 && millis() - enemy.getTimeOfDeathInMillis() > 3000)
                || enemy.isOutOfBounds(0, width, BRICK_WIDTH + BRICK_WIDTH, height)) {
                it = enemies.erase(it);
            } else {
                enemy.draw(g);
                it++;
            }
        }
    }
    if (state == VICTORY) {
        g.push();
        if (piksel::Rng::getInstance().random(0, 1) < 0.1f) {
            Firework firework(glm::vec2(piksel::Rng::getInstance().random(0, width), height));
            fireworks.push_back(firework);
        }
        for (Firework& firework : fireworks) {
            firework.applyForce(GRAVITY);
            firework.update();
            firework.draw(g);
        }
        std::vector<Firework>::iterator it = fireworks.begin();
        while (it != fireworks.end()) {
            if ((*it).isDone()) {
                it = fireworks.erase(it);
            } else {
                it++;
            }
        }
        g.pop();
    }
    drawBoundaries(g);
    character.update(BRICK_WIDTH, width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, height, paddle, bricks, millis(), width / 2, state == VICTORY || state == GAMEOVER);
    character.draw(g);
    if (state == GAME) {
        ball.update(BRICK_WIDTH, width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, height, paddle, bricks, enemySpawnDelayInMillis, width, height, millis());
        ball.draw(g);
    }
    drawScores(g);
    if (character.getLives() <= 0 || ball.getLives() <= 0) {
        state = GAMEOVER;
        bricks.clear();
    } else if (bricks.empty()) {
        state = VICTORY;
    }
    if (state == STARTSCREEN || state == GAMEOVER || state == VICTORY) {
        g.push();

        g.textSize(42);
        float hw;
        switch (state) {
            case STARTSCREEN:
                hw = 66;
                break;
            case GAMEOVER:
                hw = 166;
                break;
            case VICTORY:
            default:
                hw = 52;
                break;
        }
        float hh = height / 2 - 12;
        glm::vec4 pink = PINK;
        pink.a = 0.5;
        glm::vec4 cyan = CYAN;
        cyan.a = 0.5;
        if (glitchTimer.getElapsedTimeInMillis(millis()) > glitchDuration) {
            if (glitch) {
                glitchDuration = int(piksel::Rng::getInstance().random(300, 1500));
            } else {
                glitchDuration = int(piksel::Rng::getInstance().random(150, 300));
            }
            glitchTimer.reset(millis());
            glitch = !glitch;
        }
        if (glitch) {
            g.scale(piksel::Rng::getInstance().random(0.99f, 1.01f), piksel::Rng::getInstance().random(0.99f, 1.01f));
        }
        g.translate(hw + (glitch ? piksel::Rng::getInstance().random(-3.0f, 3.0f) : 0), hh);
        std::string str;
        switch(state) {
            case STARTSCREEN:
                str = "Mario breaks out";
                break;
            case GAMEOVER:
                str = "GAME OVER";
                break;
            case VICTORY:
            default:
                str = "CONGRATULATIONS!";
                break;
        }
        g.fill(BLACK);
        g.text(str, 0, 3);
        if (glitch) {
            g.fill(pink);
            g.text(str, -3, 0);
            g.fill(cyan);
            g.text(str, 3, 0);
        }
        g.fill(WHITE);
        g.text(str, 0, 0);
        g.pop();
        if ((g.millis() / 1000) % 2 == 0) {
            g.text(state == STARTSCREEN ? "PRESS ENTER TO START" : "PRESS ENTER TO RESTART", width / 2 - (state == STARTSCREEN ? 95 : 105), height / 2 + 42);
        }
    }
}